

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_1_5.cpp
# Opt level: O2

void __thiscall QOpenGLFunctions_1_5::~QOpenGLFunctions_1_5(QOpenGLFunctions_1_5 *this)

{
  QAtomicInt *pQVar1;
  
  (this->super_QAbstractOpenGLFunctions)._vptr_QAbstractOpenGLFunctions =
       (_func_int **)&PTR__QOpenGLFunctions_1_5_001a1a30;
  if (this->d_1_0_Core != (QOpenGLFunctions_1_0_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_0_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_1_Core != (QOpenGLFunctions_1_1_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_1_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_2_Core != (QOpenGLFunctions_1_2_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_2_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_3_Core != (QOpenGLFunctions_1_3_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_3_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_4_Core != (QOpenGLFunctions_1_4_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_4_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_5_Core != (QOpenGLFunctions_1_5_CoreBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_5_Core->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_0_Deprecated != (QOpenGLFunctions_1_0_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_0_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_1_Deprecated != (QOpenGLFunctions_1_1_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_1_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_2_Deprecated != (QOpenGLFunctions_1_2_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_2_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_3_Deprecated != (QOpenGLFunctions_1_3_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_3_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (this->d_1_4_Deprecated != (QOpenGLFunctions_1_4_DeprecatedBackend *)0x0) {
    LOCK();
    pQVar1 = &(this->d_1_4_Deprecated->super_QOpenGLVersionFunctionsBackend).refs;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
    return;
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(&this->super_QAbstractOpenGLFunctions);
  return;
}

Assistant:

QOpenGLFunctions_1_5::~QOpenGLFunctions_1_5()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_3_Core) {
        d_1_3_Core->refs.deref();
        Q_ASSERT(d_1_3_Core->refs.loadRelaxed());
    }
    if (d_1_4_Core) {
        d_1_4_Core->refs.deref();
        Q_ASSERT(d_1_4_Core->refs.loadRelaxed());
    }
    if (d_1_5_Core) {
        d_1_5_Core->refs.deref();
        Q_ASSERT(d_1_5_Core->refs.loadRelaxed());
    }
    if (d_1_0_Deprecated) {
        d_1_0_Deprecated->refs.deref();
        Q_ASSERT(d_1_0_Deprecated->refs.loadRelaxed());
    }
    if (d_1_1_Deprecated) {
        d_1_1_Deprecated->refs.deref();
        Q_ASSERT(d_1_1_Deprecated->refs.loadRelaxed());
    }
    if (d_1_2_Deprecated) {
        d_1_2_Deprecated->refs.deref();
        Q_ASSERT(d_1_2_Deprecated->refs.loadRelaxed());
    }
    if (d_1_3_Deprecated) {
        d_1_3_Deprecated->refs.deref();
        Q_ASSERT(d_1_3_Deprecated->refs.loadRelaxed());
    }
    if (d_1_4_Deprecated) {
        d_1_4_Deprecated->refs.deref();
        Q_ASSERT(d_1_4_Deprecated->refs.loadRelaxed());
    }
}